

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# locmap.cpp
# Opt level: O0

char * getPosixID(ILcidPosixMap *this_0,uint32_t hostID)

{
  uint local_20;
  uint32_t i;
  uint32_t hostID_local;
  ILcidPosixMap *this_0_local;
  
  local_20 = 0;
  while( true ) {
    if (this_0->numRegions <= local_20) {
      return this_0->regionMaps->posixID;
    }
    if (this_0->regionMaps[local_20].hostID == hostID) break;
    local_20 = local_20 + 1;
  }
  return this_0->regionMaps[local_20].posixID;
}

Assistant:

static const char*
getPosixID(const ILcidPosixMap *this_0, uint32_t hostID)
{
    uint32_t i;
    for (i = 0; i < this_0->numRegions; i++)
    {
        if (this_0->regionMaps[i].hostID == hostID)
        {
            return this_0->regionMaps[i].posixID;
        }
    }

    /* If you get here, then no matching region was found,
       so return the language id with the wild card region. */
    return this_0->regionMaps[0].posixID;
}